

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,comment *note)

{
  bool bVar1;
  ostream *in_RDI;
  bool local_b6;
  allocator local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_58 [32];
  string local_38 [48];
  ostream *local_8;
  
  bVar1 = comment::operator_cast_to_bool((comment *)0x11249b);
  if (bVar1) {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::string(local_38,local_58);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"",&local_a1);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80,local_a0);
    std::__cxx11::string::string(local_38,(string *)&stack0xffffffffffffff80);
  }
  local_8 = std::operator<<(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  if (bVar1) {
    std::__cxx11::string::~string(local_58);
  }
  else {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return local_8;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}